

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

char_type __thiscall
boost::xpressive::cpp_regex_traits<char>::widen(cpp_regex_traits<char> *this,char ch)

{
  char_type cVar1;
  char in_SIL;
  ctype<char> *in_RDI;
  
  cVar1 = std::ctype<char>::widen(in_RDI,in_SIL);
  return cVar1;
}

Assistant:

char_type widen(char ch) const
    {
        return this->ctype_->widen(ch);
    }